

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInst
          (RACFGBuilder *this,InstNode *inst,InstControlFlow *cf,RAInstBuilder *ib)

{
  byte *pbVar1;
  RAWorkReg *pRVar2;
  uint *puVar3;
  FuncValue *arg;
  InstNode IVar4;
  uint uVar5;
  RegMask useRegMask;
  BaseBuilder *pBVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  _func_int *p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Error EVar13;
  Error EVar14;
  byte bVar15;
  byte bVar16;
  char cVar17;
  uint uVar18;
  uint32_t uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  Error EVar23;
  Error EVar24;
  RATiedReg *tiedReg;
  RAStackSlot *pRVar25;
  ulong uVar26;
  undefined8 extraout_RAX;
  undefined1 *puVar27;
  undefined4 uVar28;
  uint32_t uVar29;
  RAInstBuilder *__range4;
  BaseRAPass *pBVar30;
  BaseRAPass *pBVar31;
  long lVar32;
  InstId IVar33;
  undefined1 *puVar34;
  Environment EVar35;
  Environment invokeNode;
  BaseRAPass *pBVar36;
  uint32_t uVar37;
  uint32_t uVar38;
  long lVar39;
  long lVar40;
  InstNode *pIVar41;
  ulong uVar42;
  InstControlFlow *pIVar43;
  undefined1 uVar44;
  uint uVar45;
  Operand_ *pOVar46;
  undefined7 uVar47;
  Imm *imm_;
  InstNode *pIVar48;
  long lVar49;
  uint uVar50;
  InstControlFlow *pIVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  Error EStackY_260;
  Operand_ OStackY_230;
  Operand_ OStackY_220;
  RAWorkReg *pRStackY_210;
  FuncValue *pFStackY_208;
  ulong uStackY_200;
  uint local_1b4;
  RAWorkReg *workReg;
  uint local_1a4;
  BaseRAPass *local_1a0;
  RACFGBuilder *local_198;
  InstNode *local_190;
  InstNode *local_188;
  RAWorkReg *local_180;
  BaseRAPass *local_178;
  int local_170;
  uint local_16c;
  ulong local_168;
  Operand_ *local_160;
  InstControlFlow *local_158;
  InstNode *local_150;
  RAWorkReg *local_148;
  Environment local_140;
  BaseRAPass *local_138;
  InstRWInfo rwInfo;
  Operand_ *operands;
  
  local_150 = (InstNode *)(ulong)*(uint *)(inst + 0x30);
  if ((InstNode *)0x6ba < local_150) {
    return 0;
  }
  EVar35 = (Environment)(inst + 0x30);
  IVar4 = inst[0x12];
  pBVar30 = (BaseRAPass *)(ulong)(byte)IVar4;
  operands = (Operand_ *)(inst + 0x40);
  pBVar36 = (BaseRAPass *)(ulong)(byte)this[0x290];
  puVar34 = (undefined1 *)EVar35;
  local_158 = cf;
  uVar18 = InstInternal::queryRWInfo
                     ((Arch)this[0x290],(BaseInst *)EVar35,operands,(size_t)pBVar30,&rwInfo);
  uVar42 = (ulong)uVar18;
  if (uVar18 != 0) {
    bVar52 = false;
    goto LAB_001499dc;
  }
  *(InstRWFlags *)(ib + 4) = *(InstRWFlags *)(ib + 4) | rwInfo._instFlags & ~kMovOp;
  local_1a0 = (BaseRAPass *)ib;
  local_198 = this;
  local_190 = inst;
  local_140 = EVar35;
  if (IVar4 != (InstNode)0x0) {
    puVar27 = InstDB::_commonInfoTable;
    uVar18 = *(uint *)(InstDB::_commonInfoTable +
                      (*(uint *)(InstDB::_instInfoTable + (long)local_150 * 8) >> 0xb & 0x1ff8));
    if ((uVar18 >> 0x17 & 1) == 0) {
      local_1b4 = 0xffff;
      if ((uVar18 >> 0x1c & 1) != 0) {
        ib[0xb] = (RAInstBuilder)((byte)ib[0xb] | 0x80);
        local_1b4 = 0xffffffff;
      }
    }
    else {
      puVar27 = (undefined1 *)(ulong)(uVar18 & 0x2400000);
      local_1b4 = 0xffffffff;
      if ((uVar18 & 0x2400000) == 0x400000) {
        if ((uVar18 >> 0x1a & 1) == 0) {
          local_1b4 = 0xffff;
          if ((uVar18 >> 0x1b & 1) != 0) {
            local_1b4 = -(uint)(IVar4 == (InstNode)0x2) | 0xffff;
          }
        }
        else {
          local_1b4 = -(uint)(((operands->_signature)._bits & 0xff000fff) == 0x289) | 0xffff;
          puVar27 = (undefined1 *)(ulong)local_1b4;
        }
      }
    }
    pBVar36 = (BaseRAPass *)(ulong)(uint)(byte)IVar4;
    pIVar41 = (InstNode *)(ulong)(((uint)(byte)IVar4 + (uint)(IVar4 == (InstNode)0x0)) * 0x10);
    local_180 = (RAWorkReg *)CONCAT44(local_180._4_4_,0xffffffff);
    pOVar46 = (Operand_ *)CONCAT71((int7)((ulong)operands >> 8),1);
    pIVar48 = (InstNode *)0x0;
    pBVar31 = (BaseRAPass *)0x0;
    local_16c = 0;
    local_1a4 = 0;
    pIVar43 = (InstControlFlow *)0x0;
    local_170 = 0;
    local_148 = (RAWorkReg *)0xffffffff;
    local_188 = pIVar41;
    local_178 = pBVar36;
    local_160 = operands;
    local_138 = pBVar30;
    do {
      uVar18 = (uint)uVar42;
      uVar21 = (uint)puVar27;
      if (pIVar48 == (InstNode *)0x60) {
        onInst();
        goto LAB_00149a8e;
      }
      uVar21 = *(uint *)(inst + 0x40 + (long)pIVar48);
      uVar50 = uVar21 & 7;
      pIVar51 = (InstControlFlow *)(ulong)uVar50;
      uVar44 = SUB81(pOVar46,0);
      if (uVar50 == 2) {
        pbVar1 = (byte *)((long)&(((BaseRAPass *)ib)->super_FuncPass).super_Pass._cb + 4);
        *pbVar1 = *pbVar1 | 0x30;
        if ((uVar21 >> 0xd & 1) == 0) {
          if ((uVar21 & 0xf8) < 9) {
LAB_00149242:
            puVar27 = (RAWorkReg *)0x1f01;
            if ((0x100 < (*(uint *)(inst + 0x40 + (long)pIVar48) & 0x1f00)) &&
               (uVar18 = *(int *)(inst + 0x48 + (long)pIVar48) - 0x100, uVar18 < 0xfffffeff)) {
              pBVar36 = *(BaseRAPass **)this;
              pBVar6 = (pBVar36->super_FuncPass).super_Pass._cb;
              if (uVar18 < *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
                puVar34 = *(undefined1 **)
                           (&(pBVar6[1].super_BaseEmitter._code)->_environment + uVar18);
                workReg = *(RAWorkReg **)((long)puVar34 + 0x28);
                uVar26 = 0;
                if (workReg == (RAWorkReg *)0x0) {
                  EVar24 = BaseRAPass::_asWorkReg(pBVar36,(VirtReg *)puVar34,&workReg);
                  uVar26 = (ulong)EVar24;
                  ib = (RAInstBuilder *)local_1a0;
                  this = local_198;
                  inst = local_190;
                  pIVar41 = local_188;
                }
              }
              else {
                uVar26 = 0x1e;
              }
              if ((int)uVar26 != 0) goto LAB_001492c6;
              if (3 < ((byte)workReg[0x21] & 0xf)) {
                onInst();
                goto LAB_00149aa9;
              }
              uVar18 = *(uint *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + -7);
              uVar21 = *(uint *)(*(long *)this + 0x118 + (ulong)((byte)workReg[0x21] & 0xf) * 4) &
                       local_1b4;
              uVar26 = (ulong)uVar21;
              uVar29 = InstNode::getRewriteIndex(inst,(uint32_t *)(inst + (long)pIVar48 + 0x48));
              ib = (RAInstBuilder *)local_1a0;
              uVar38 = 1 << ((byte)uVar29 & 0x1f);
              uVar29 = 0;
              if ((5U >> (uVar18 >> 0xe & 3) & 1) == 0) {
                uVar29 = uVar38;
                uVar38 = 0;
              }
              uStackY_200 = 0x14937f;
              puVar34 = workReg;
              EVar24 = RAInstBuilder::add((RAInstBuilder *)local_1a0,workReg,kUse|kRead,uVar21,0xff,
                                          uVar29,uVar21,0xff,uVar38,0,0xffffffff);
              puVar27 = (undefined1 *)CONCAT71((int7)(uVar26 >> 8),EVar24 == 0);
              uVar18 = (uint)uVar42;
              if (EVar24 != 0) {
                uVar18 = EVar24;
              }
              uVar42 = (ulong)uVar18;
              pOVar46 = (Operand_ *)(ulong)CONCAT31((int3)(uVar21 >> 8),(char)pOVar46);
              pBVar36 = local_178;
              this = local_198;
              inst = local_190;
              pIVar41 = local_188;
            }
          }
          else {
            uVar21 = *(int *)(inst + 0x44 + (long)pIVar48) - 0x100;
            bVar52 = true;
            if (uVar21 < 0xfffffeff) {
              pBVar36 = *(BaseRAPass **)this;
              pBVar6 = (pBVar36->super_FuncPass).super_Pass._cb;
              if (uVar21 < *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
                puVar34 = *(undefined1 **)
                           (&(pBVar6[1].super_BaseEmitter._code)->_environment + uVar21);
                workReg = *(RAWorkReg **)((long)puVar34 + 0x28);
                uVar42 = 0;
                if (workReg == (RAWorkReg *)0x0) {
                  EVar24 = BaseRAPass::_asWorkReg(pBVar36,(VirtReg *)puVar34,&workReg);
                  uVar42 = (ulong)EVar24;
                  ib = (RAInstBuilder *)local_1a0;
                  this = local_198;
                  inst = local_190;
                  pIVar41 = local_188;
                }
              }
              else {
                uVar42 = 0x1e;
              }
              if ((int)uVar42 != 0) {
                bVar52 = false;
                pBVar36 = local_178;
                goto LAB_0014923a;
              }
              if (((byte)workReg[0x21] & 0xf) < 4) {
                uVar45 = *(uint *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + -7) >> 0xc &
                         3;
                uVar21 = *(uint *)(raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map +
                                  (ulong)uVar45 * 4);
                uVar26 = (ulong)uVar21;
                local_168 = (ulong)*(uint *)(*(long *)this + 0x118 +
                                            (ulong)((byte)workReg[0x21] & 0xf) * 4);
                uVar29 = InstNode::getRewriteIndex(inst,(uint32_t *)(inst + (long)pIVar48 + 0x44));
                ib = (RAInstBuilder *)local_1a0;
                uVar29 = 1 << ((byte)uVar29 & 0x1f);
                uVar22 = *(uint *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + -7);
                if ((5U >> uVar45 & 1) == 0) {
                  uVar19 = 0xff;
                  uVar37 = uVar29;
                  uVar29 = 0;
                  if ((uVar22 >> 9 & 1) == 0) {
                    uVar38 = 0xff;
                  }
                  else {
                    uVar38 = (uint32_t)rwInfo._operands[0]._reserved[(long)pIVar48 * 2 + -3];
                    uVar26 = (ulong)(uVar21 | 0x40);
                  }
                }
                else {
                  uVar38 = 0xff;
                  if ((uVar22 >> 9 & 1) == 0) {
                    uVar37 = 0;
                    uVar19 = 0xff;
                  }
                  else {
                    uVar19 = (uint32_t)rwInfo._operands[0]._reserved[(long)pIVar48 * 2 + -3];
                    uVar26 = (ulong)(uVar21 | 0x80);
                    uVar37 = 0;
                  }
                }
                uStackY_200 = 0x14920f;
                puVar34 = workReg;
                EVar24 = RAInstBuilder::add((RAInstBuilder *)local_1a0,workReg,(RATiedFlags)uVar26,
                                            (RegMask)local_168,uVar38,uVar37,(RegMask)local_168,
                                            uVar19,uVar29,0,0xffffffff);
                bVar52 = EVar24 == 0;
                if (!bVar52) {
                  uVar18 = EVar24;
                }
                uVar42 = (ulong)uVar18;
                pOVar46 = (Operand_ *)CONCAT71((int7)(uVar26 >> 8),uVar44);
                pBVar36 = local_178;
                this = local_198;
                inst = local_190;
                pIVar41 = local_188;
                goto LAB_0014923a;
              }
LAB_00149aa9:
              onInst();
LAB_00149aae:
              onInst();
              goto LAB_00149ab3;
            }
LAB_0014923a:
            if (bVar52) goto LAB_00149242;
            puVar27 = (RAWorkReg *)0x0;
          }
        }
        else {
          pBVar6 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
          if (*(int *)(inst + 0x44 + (long)pIVar48) - 0x100U <
              *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
            puVar34 = *(undefined1 **)
                       (&(pBVar6[1].super_BaseEmitter._code)->_environment +
                       (*(int *)(inst + 0x44 + (long)pIVar48) - 0x100U));
            workReg = *(RAWorkReg **)((long)puVar34 + 0x28);
            uVar26 = 0;
            if (workReg == (RAWorkReg *)0x0) {
              EVar24 = BaseRAPass::_asWorkReg(*(BaseRAPass **)this,(VirtReg *)puVar34,&workReg);
              uVar26 = (ulong)EVar24;
              ib = (RAInstBuilder *)local_1a0;
              this = local_198;
              inst = local_190;
              pIVar41 = local_188;
            }
          }
          else {
            uVar26 = 0x1e;
          }
          pRVar2 = workReg;
          if ((int)uVar26 == 0) {
            ib = (RAInstBuilder *)local_1a0;
            pBVar36 = local_178;
            if (*(long *)(workReg + 0x18) == 0) {
              uVar18 = *(uint *)(*(long *)this + 0x1dc);
              puVar34._4_1_ = kUnknown;
              puVar34._5_1_ = kUnknown;
              puVar34._6_1_ = kHardFloat;
              puVar34._7_1_ = '\0';
              puVar34._0_1_ = (char)uVar18;
              puVar34._1_1_ = (char)(uVar18 >> 8);
              puVar34._2_1_ = (char)(uVar18 >> 0x10);
              puVar34._3_1_ = (char)(uVar18 >> 0x18);
              pRVar25 = RAStackAllocator::newSlot
                                  ((RAStackAllocator *)(*(long *)this + 0x1f8),uVar18,
                                   *(uint32_t *)(*(long *)(workReg + 8) + 8),
                                   (uint)*(byte *)(*(long *)(workReg + 8) + 0xc),1);
              pOVar46 = (Operand_ *)CONCAT71((int7)(uVar42 >> 8),uVar44);
              *(RAStackSlot **)(pRVar2 + 0x18) = pRVar25;
              pRVar2 = pRVar2 + 0x25;
              *pRVar2 = (RAWorkReg)((byte)*pRVar2 | 1);
              ib = (RAInstBuilder *)local_1a0;
              pBVar36 = local_178;
              this = local_198;
              inst = local_190;
              pIVar41 = local_188;
            }
            goto LAB_00149242;
          }
LAB_001492c6:
          puVar27 = (RAWorkReg *)0x0;
          pBVar36 = local_178;
          uVar42 = uVar26;
        }
        if ((char)puVar27 != '\0') goto LAB_001492d9;
LAB_00149521:
        bVar52 = false;
      }
      else {
        if (uVar50 == 1) {
          uVar18 = *(uint *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + -7);
          puVar34 = raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map;
          uVar45 = (uVar18 & 0x80) << 8 |
                   *(uint *)(raUseOutFlagsFromRWFlags(asmjit::v1_14::OpRWFlags)::map +
                            (ulong)(uVar18 & 7) * 4);
          operands = (Operand_ *)(ulong)uVar45;
          uVar22 = local_1b4;
          if (((uVar21 & 0xff000000) == 0x1000000) && ((uVar18 & 0x100) == 0)) {
            operands = (Operand_ *)(ulong)(uVar45 | 0x1000000);
            uVar22 = 0xf;
            if (this[0x291] == (RACFGBuilder)0x1) {
              bVar52 = (uVar21 & 0x1000fff) == 0x1000021;
              uVar22 = local_1b4;
              if (bVar52) {
                uVar22 = 0xf;
              }
              local_16c = local_16c & 0xff;
              if (bVar52) {
                local_16c = 1;
              }
            }
          }
          uVar18 = *(int *)(inst + 0x44 + (long)pIVar48) - 0x100;
          puVar27 = (undefined1 *)(ulong)uVar18;
          bVar52 = true;
          if (uVar18 < 0xfffffeff) {
            pBVar6 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
            if (uVar18 < *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
              puVar34 = *(undefined1 **)
                         (&(pBVar6[1].super_BaseEmitter._code)->_environment + uVar18);
              puVar27 = *(undefined1 **)((long)puVar34 + 0x28);
              uVar18 = 0;
              workReg = (RAWorkReg *)puVar27;
              if ((RAWorkReg *)puVar27 == (RAWorkReg *)0x0) {
                uVar18 = BaseRAPass::_asWorkReg(*(BaseRAPass **)this,(VirtReg *)puVar34,&workReg);
                ib = (RAInstBuilder *)local_1a0;
                this = local_198;
                inst = local_190;
                pIVar41 = local_188;
              }
            }
            else {
              uVar18 = 0x1e;
            }
            if (uVar18 != 0) {
              uVar42 = (ulong)uVar18;
            }
            uVar21 = (uint)uVar42;
            if (uVar18 == 0) {
              if ((((uint)operands & 3) == 2) &&
                 ((*(ulong *)(workReg + 0x40) &
                  ~(*(ulong *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + 0x11) |
                   *(ulong *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + 9))) != 0)) {
                operands = (Operand_ *)(ulong)((uint)operands & 0xfffffff2 | 5);
              }
              if ((((ulong)rwInfo._rmFeature != 0) && (((ulong)operands & 0x30) != 0)) &&
                 ((*(ulong *)(*(long *)(*(long *)(this + 8) + 0x30) + 8 +
                             (ulong)(rwInfo._rmFeature >> 6) * 8) >>
                   ((ulong)rwInfo._rmFeature & 0x3f) & 1) == 0)) {
                operands = (Operand_ *)((ulong)operands & 0xffffffffffffffcf);
              }
              puVar34 = workReg;
              pBVar36 = local_178;
              if (3 < ((byte)workReg[0x21] & 0xf)) {
                onInst();
                goto LAB_00149a9a;
              }
              uVar22 = uVar22 & *(uint *)(*(long *)this + 0x118 +
                                         (ulong)((byte)workReg[0x21] & 0xf) * 4);
              bVar15 = rwInfo._operands[0]._reserved[(long)pIVar48 * 2 + -1];
              puVar27 = (undefined1 *)(ulong)bVar15;
              if (bVar15 != 0) {
                if ((uint)local_180 == 0xffffffff) {
                  if (((ulong)operands & 0x6000) == 0) {
                    if (bVar15 < 5) {
                      uVar45 = (uint)bVar15 * 0x2000 - 0x1000 | (uint)operands;
                      uVar18 = *(uint *)workReg;
                      if (((ulong)operands & 4) == 0) {
                        operands = (Operand_ *)(ulong)(uVar45 | 0x800);
                        local_168 = CONCAT44(local_168._4_4_,uVar22);
                        local_180 = (RAWorkReg *)puVar27;
                        uVar22 = *(uint *)(raConsecutiveLeadCountToRegMaskFilter + (long)puVar27 * 4
                                          ) & uVar22;
                      }
                      else {
                        local_168 = CONCAT44(local_168._4_4_,
                                             *(uint *)(raConsecutiveLeadCountToRegMaskFilter +
                                                      (long)puVar27 * 4) & uVar22);
                        operands = (Operand_ *)(ulong)(uVar45 | 0x400);
                        local_180 = (RAWorkReg *)puVar27;
                      }
                      goto LAB_00148fc0;
                    }
                    goto LAB_00149abd;
                  }
                  uVar42 = 0x3c;
                  local_180 = (RAWorkReg *)CONCAT44(local_180._4_4_,0xffffffff);
                }
                else {
                  uVar42 = 3;
                }
                bVar52 = false;
                goto LAB_00149514;
              }
              local_168 = CONCAT44(local_168._4_4_,uVar22);
              uVar18 = (uint)local_180;
LAB_00148fc0:
              local_180 = (RAWorkReg *)CONCAT44(local_180._4_4_,uVar18);
              uVar42 = (long)(pIVar48 + 8) >> 2;
              uVar45 = (uint)operands;
              if (((ulong)operands & 4) == 0) {
                if (0x19 < uVar42) goto LAB_00149aae;
                uVar29 = 1 << ((byte)uVar42 & 0x1f);
                uVar5 = *(uint *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + -7);
                if ((uVar5 >> 8 & 1) != 0) {
                  uVar19 = (uint32_t)rwInfo._operands[0]._reserved[(long)pIVar48 * 2 + -3];
                  operands = (Operand_ *)(ulong)(uVar45 | 0x80);
                  uVar38 = 0xff;
                  uVar37 = 0;
                  goto LAB_00149476;
                }
                if ((uVar5 & 8) == 0) {
                  uVar37 = 0;
                  goto LAB_00149470;
                }
                ib = (RAInstBuilder *)local_1a0;
                if (uVar18 != 0xffffffff) {
                  if (uVar18 == *(uint *)workReg) {
                    uVar42 = 0x41;
                    goto LAB_00149414;
                  }
                  if (local_170 + 1U < 4) {
                    uVar18 = (local_170 + 1U) * 0x2000 | uVar45 | 0x800;
                    uVar37 = 0;
                    goto LAB_0014946d;
                  }
                  goto LAB_00149ad6;
                }
                uVar42 = 3;
                local_180 = (RAWorkReg *)CONCAT44(local_180._4_4_,0xffffffff);
              }
              else {
                if (0x19 < uVar42) {
LAB_00149ab3:
                  onInst();
                  goto LAB_00149ab8;
                }
                uVar37 = 1 << ((byte)uVar42 & 0x1f);
                uVar5 = *(uint *)(rwInfo._operands[0]._reserved + (long)pIVar48 * 2 + -7);
                if ((uVar5 >> 8 & 1) != 0) {
                  uVar38 = (uint32_t)rwInfo._operands[0]._reserved[(long)pIVar48 * 2 + -3];
                  operands = (Operand_ *)(ulong)(uVar45 | 0x40);
                  uVar19 = 0xff;
                  uVar29 = 0;
                  goto LAB_00149476;
                }
                if ((uVar5 & 8) == 0) {
                  uVar29 = 0;
LAB_00149470:
                  uVar19 = 0xff;
                  uVar38 = 0xff;
LAB_00149476:
                  puVar27 = (undefined1 *)(local_168 & 0xffffffff);
                  uStackY_200 = 0x1494a1;
                  EVar24 = RAInstBuilder::add((RAInstBuilder *)local_1a0,workReg,
                                              (RATiedFlags)operands,(RegMask)local_168,uVar38,uVar37
                                              ,uVar22,uVar19,uVar29,
                                              (uint)rwInfo._operands[0]._reserved
                                                    [(long)pIVar48 * 2 + -2],(uint32_t)local_148);
                  if (EVar24 != 0) {
                    uVar21 = EVar24;
                  }
                  uVar42 = (ulong)uVar21;
                  ib = (RAInstBuilder *)local_1a0;
                  this = local_198;
                  inst = local_190;
                  pIVar41 = local_188;
                  if (EVar24 == 0) {
                    puVar27 = (undefined1 *)(ulong)(pBVar31 == (BaseRAPass *)(ulong)local_1a4);
                    local_1a4 = local_1a4 + (pBVar31 == (BaseRAPass *)(ulong)local_1a4);
                    bVar52 = true;
                    pBVar36 = local_178;
                    if (((ulong)operands & 0x1c00) != 0) {
                      puVar27 = (undefined1 *)(ulong)*(uint *)workReg;
                      local_148 = (RAWorkReg *)puVar27;
                    }
                    goto LAB_00149514;
                  }
                  goto LAB_00148e1c;
                }
                this = local_198;
                if (uVar18 == 0xffffffff) {
                  uVar42 = 3;
                  local_180 = (RAWorkReg *)CONCAT44(local_180._4_4_,0xffffffff);
                }
                else {
                  if (uVar18 != *(uint *)workReg) {
                    if (local_170 + 1U < 4) {
                      uVar18 = (local_170 + 1U) * 0x2000 | uVar45 | 0x400;
                      uVar29 = 0;
LAB_0014946d:
                      local_170 = local_170 + 1;
                      operands = (Operand_ *)(ulong)uVar18;
                      goto LAB_00149470;
                    }
                    goto LAB_00149adb;
                  }
                  uVar42 = 0x41;
                }
              }
LAB_00149414:
              puVar27 = (undefined1 *)(ulong)uVar18;
              bVar52 = false;
              pIVar41 = local_188;
              goto LAB_00149514;
            }
LAB_00148e1c:
            bVar52 = false;
            uVar47 = (undefined7)((ulong)operands >> 8);
            pBVar36 = local_178;
          }
          else {
LAB_00149514:
            uVar47 = (undefined7)((ulong)operands >> 8);
          }
          pOVar46 = (Operand_ *)CONCAT71(uVar47,uVar44);
          if (!bVar52) goto LAB_00149521;
        }
LAB_001492d9:
        bVar52 = true;
      }
      uVar18 = (uint)uVar42;
      pIVar43 = (InstControlFlow *)(ulong)((uint)pIVar43 | 1 << uVar50);
      if (!bVar52) {
        uVar21 = 1;
        goto LAB_0014957b;
      }
      pBVar31 = (BaseRAPass *)((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass + 1);
      pOVar46 = (Operand_ *)CONCAT71((int7)((ulong)pOVar46 >> 8),pBVar31 < pBVar36);
      pIVar48 = pIVar48 + 0x10;
    } while (pIVar41 != pIVar48);
    uVar21 = 0;
LAB_0014957b:
    pBVar30 = local_138;
    operands = local_160;
    pIVar51 = pIVar43;
    if (((ulong)pOVar46 & 1) == 0) goto LAB_0014959c;
LAB_001499d7:
    bVar52 = uVar21 == 0;
LAB_001499dc:
    if (bVar52) {
      return 0;
    }
    return uVar18;
  }
  local_1a4 = 0;
  local_16c = 0;
  pIVar51 = (InstControlFlow *)0x0;
  pIVar48 = inst;
LAB_0014959c:
  pIVar41 = local_150;
  pIVar43 = local_158;
  uVar50 = (uint)pBVar30;
  uVar21 = *(uint *)(inst + 0x38);
  pOVar46 = operands;
  if (uVar21 == 0) {
LAB_00149714:
    if (((((rwInfo._instFlags & kMovOp) != kNone) && (*(int *)(inst + 0x38) == 0)) &&
        (((ulong)pIVar51 & 2) != 0)) &&
       (((uVar50 == 2 ||
         ((uVar50 == 3 &&
          (auVar53._0_4_ = -(uint)(*(int *)(inst + 0x50) == *(int *)(inst + 0x40)),
          auVar53._4_4_ = -(uint)(*(int *)(inst + 0x54) == *(int *)(inst + 0x44)),
          auVar53._8_4_ = -(uint)(*(int *)(inst + 0x58) == *(int *)(inst + 0x48)),
          auVar53._12_4_ = -(uint)(*(int *)(inst + 0x5c) == *(int *)(inst + 0x4c)),
          iVar20 = movmskps(uVar21,auVar53), iVar20 == 0xf)))) &&
        (uVar21 = *(int *)(inst + 0x44) - 0x100, uVar21 < 0xfffffeff)))) {
      if (uVar21 < *(uint *)(*(long *)(this + 8) + 0x1f0)) {
        uVar42 = ~rwInfo._operands[0]._writeByteMask &
                 *(ulong *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 8) + 0x1e8) +
                                               (ulong)uVar21 * 8) + 0x28) + 0x40);
        if ((uVar42 == 0) || ((rwInfo._operands[0]._extendByteMask & uVar42) == 0)) {
          pbVar1 = (byte *)((long)&(((BaseRAPass *)ib)->super_FuncPass).super_Pass._vptr_Pass + 4);
          *pbVar1 = *pbVar1 | 1;
        }
        goto LAB_00149722;
      }
      goto LAB_00149acc;
    }
LAB_00149722:
    if ((local_16c & 1) != 0) {
      puVar7 = *(undefined1 **)&((BaseRAPass *)ib)->field_0x38;
      for (puVar27 = &((BaseRAPass *)ib)->field_0x40; puVar27 != puVar7; puVar27 = puVar27 + 0x20) {
        uVar28 = 0xff;
        if ((*(uint *)(puVar27 + 8) >> 0x18 & 1) != 0) {
          uVar28 = 0xf;
        }
        *(ulong *)(puVar27 + 0x10) = CONCAT44(uVar28,uVar28) & *(ulong *)(puVar27 + 0x10);
      }
    }
    if ((*(long *)&((BaseRAPass *)ib)->field_0x38 - (long)&((BaseRAPass *)ib)->field_0x40 &
        0x1fffffffe0U) != 0x20) {
LAB_001499ad:
      *pIVar43 = *(uint *)(InstDB::_commonInfoTable +
                          (ulong)(*(uint *)(InstDB::_instInfoTable + (long)pIVar41 * 8) >> 0xb &
                                 0x1ff8) + 4) >> 0x1b & (kMaxValue|kCall);
      uVar21 = 0;
      goto LAB_001499d7;
    }
    if (local_1a4 == uVar50) {
      bVar15 = (byte)((uint)*(undefined4 *)
                             (InstDB::_commonInfoTable +
                             (ulong)(*(uint *)(InstDB::_instInfoTable + (long)pIVar41 * 8) >> 0xb &
                                    0x1ff8) + 4) >> 0x1e);
      goto LAB_0014996d;
    }
    if (uVar50 == 4) {
      if ((byte)inst[0x13] < 4) goto LAB_00149ac2;
      if ((((*(uint *)(inst + 0x70) & 7) == 4) && ((*(uint *)local_140 & 0xfffffffe) == 0x61c)) &&
         ((inst[0x78] == (InstNode)0xff || (inst[0x78] == (InstNode)0x0)))) {
        *(uint *)&((BaseRAPass *)ib)->field_0x48 =
             *(uint *)&((BaseRAPass *)ib)->field_0x48 & 0xfffffff2 | 8;
        *(uint *)&((BaseRAPass *)ib)->field_0x5c =
             *(uint *)&((BaseRAPass *)ib)->field_0x5c | *(uint *)&((BaseRAPass *)ib)->field_0x58;
        *(undefined4 *)&((BaseRAPass *)ib)->field_0x58 = 0;
      }
LAB_0014996b:
      bVar15 = 0;
LAB_0014996d:
      if (bVar15 == 2) {
        *(uint *)&((BaseRAPass *)ib)->field_0x48 =
             *(uint *)&((BaseRAPass *)ib)->field_0x48 & 0xfffffff2 | 8;
        *(uint *)&((BaseRAPass *)ib)->field_0x5c =
             *(uint *)&((BaseRAPass *)ib)->field_0x5c | *(uint *)&((BaseRAPass *)ib)->field_0x58;
        *(undefined4 *)&((BaseRAPass *)ib)->field_0x58 = 0;
      }
      else if (bVar15 == 1) {
        *(uint *)&((BaseRAPass *)ib)->field_0x48 =
             *(uint *)&((BaseRAPass *)ib)->field_0x48 & 0xfffffff1 | 4;
        *(uint *)&((BaseRAPass *)ib)->field_0x58 =
             *(uint *)&((BaseRAPass *)ib)->field_0x58 | *(uint *)&((BaseRAPass *)ib)->field_0x5c;
        *(undefined4 *)&((BaseRAPass *)ib)->field_0x5c = 0;
      }
      goto LAB_001499ad;
    }
    if (uVar50 != 2) goto LAB_0014996b;
    if ((byte)inst[0x13] < 2) goto LAB_00149ac7;
    if ((*(uint *)(inst + 0x50) & 7) != 4) goto LAB_0014996b;
    uVar21 = *(uint *)&((BaseRAPass *)ib)->field_0x40;
    if (uVar21 < *(uint *)(*(long *)this + 0x148)) {
      uVar21 = *(uint *)(*(long *)(*(long *)(*(long *)this + 0x140) + (ulong)uVar21 * 8) + 0x20);
      iVar20 = *(int *)local_140;
      bVar16 = 0;
      bVar15 = 0;
      if (iVar20 < 0x2b7) {
        if ((iVar20 != 9) && (iVar20 != 0x17)) {
          if (iVar20 != 0x1eb) goto LAB_0014996d;
          uVar50 = (pOVar46->_signature)._bits;
          uVar22 = uVar50 >> 0x18;
          if ((uVar50 < 0x4000000) && (uVar22 < uVar21 >> 0x18)) {
LAB_00149a8e:
            bVar16 = 0;
          }
          else {
            if (*(long *)(inst + 0x58) != -1) {
              puVar34._0_4_ = uVar22 - 1;
              puVar34._4_1_ = kUnknown;
              puVar34._5_1_ = kUnknown;
              puVar34._6_1_ = kHardFloat;
              puVar34._7_1_ = '\0';
              if (0xfe < (uint)puVar34) goto LAB_00149ae0;
              uVar50 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
                }
              }
              if (*(long *)(inst + 0x58) !=
                  *(long *)(raImmMaskFromSize(unsigned_int)::masks + (ulong)uVar50 * 8))
              goto LAB_00149a8e;
            }
            bVar16 = 2;
          }
        }
LAB_001498e5:
        if (((*(char *)((long)&(pOVar46->_signature)._bits + 3) != '\x04') ||
            (bVar15 = bVar16, uVar21 < 0x5000000)) &&
           (bVar15 = 1, *(int *)(inst + 0x58) != 0 || *(int *)(inst + 0x5c) != 0)) {
          bVar15 = bVar16;
        }
      }
      else if (iVar20 < 0x2f9) {
        if ((iVar20 - 0x2b7U < 0x40) &&
           (bVar16 = 0, (0x8000000000002003U >> ((ulong)(iVar20 - 0x2b7U) & 0x3f) & 1) != 0))
        goto LAB_001498e5;
      }
      else if (((iVar20 == 0x2f9) || (iVar20 == 0x311)) || (iVar20 == 0x6a8)) goto LAB_001498e5;
      goto LAB_0014996d;
    }
  }
  else {
    uVar22 = *(int *)(inst + 0x3c) - 0x100;
    if (0xfffffefe < uVar22) {
      bVar52 = true;
      if (((uVar21 & 0xf00) == 0x200) && (*(int *)(inst + 0x3c) != 0)) {
        local_1a4 = 0;
      }
LAB_00149702:
      uVar21 = 1;
      ib = (RAInstBuilder *)local_1a0;
      if (!bVar52) goto LAB_001499d7;
      goto LAB_00149714;
    }
    pBVar36 = *(BaseRAPass **)this;
    pBVar6 = (pBVar36->super_FuncPass).super_Pass._cb;
    pBVar31 = pBVar30;
    uVar21 = uVar18;
    if (uVar22 < *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
      puVar34 = *(undefined1 **)(&(pBVar6[1].super_BaseEmitter._code)->_environment + uVar22);
      workReg = *(RAWorkReg **)((long)puVar34 + 0x28);
      uVar18 = 0;
      if (workReg == (RAWorkReg *)0x0) {
        uVar18 = BaseRAPass::_asWorkReg(pBVar36,(VirtReg *)puVar34,&workReg);
        ib = (RAInstBuilder *)local_1a0;
        this = local_198;
        inst = local_190;
        pIVar48 = pIVar41;
      }
    }
    else {
LAB_00149a9a:
      uVar50 = (uint)pBVar31;
      uVar18 = 0x1e;
    }
    if (uVar18 != 0) {
      bVar52 = false;
      pOVar46 = operands;
      goto LAB_00149702;
    }
    bVar15 = (byte)workReg[0x21] & 0xf;
    puVar34 = workReg;
    local_160 = operands;
    if (bVar15 < 4) {
      useRegMask = *(RegMask *)(*(long *)this + 0x118 + (ulong)bVar15 * 4);
      if (bVar15 == 2) {
        pIVar48 = (InstNode *)0x0;
        uStackY_200 = 0x14969e;
        uVar18 = RAInstBuilder::add(ib,workReg,kUse|kRead,useRegMask,0xff,1,useRegMask,0xff,0,0,
                                    0xffffffff);
      }
      else {
        uStackY_200 = 0x1496ce;
        uVar18 = RAInstBuilder::add(ib,workReg,kUse|kRW,useRegMask,1,1,useRegMask,0xff,0,0,
                                    0xffffffff);
        pIVar48 = (InstNode *)(ulong)local_1a4;
      }
      bVar52 = false;
      pBVar36 = (BaseRAPass *)ib;
      this = local_198;
      inst = local_190;
      pIVar43 = local_158;
      pOVar46 = local_160;
      if (uVar18 == 0) {
        bVar52 = true;
        uVar18 = uVar21;
        local_1a4 = (uint)pIVar48;
      }
      goto LAB_00149702;
    }
LAB_00149ab8:
    onInst();
LAB_00149abd:
    onInst();
LAB_00149ac2:
    onInst();
LAB_00149ac7:
    onInst();
LAB_00149acc:
    onInst();
  }
  onInst();
LAB_00149ad6:
  onInst();
LAB_00149adb:
  onInst();
LAB_00149ae0:
  onInst();
  uStackY_200 = (ulong)*(byte *)((long)puVar34 + 0xf4);
  pBVar6 = (pBVar36->super_FuncPass).super_Pass._cb;
  uVar29 = (pBVar6->super_BaseEmitter)._gpSignature._bits;
  EVar35._1_7_ = SUB87(puVar34,1);
  pBVar6->_cursor = *(BaseNode **)puVar34;
  if (uStackY_200 == 0) {
    bVar52 = true;
  }
  else {
    EVar35._arch = (byte)uVar29 >> 3;
    lVar39 = (long)puVar34 + 0x11c;
    lVar40 = 0;
    uVar42 = 0;
    invokeNode = EVar35;
    do {
      if (uVar42 == 0x20) {
LAB_0014a30a:
        onBeforeInvoke();
LAB_0014a30f:
        onBeforeInvoke();
        goto LAB_0014a314;
      }
      lVar32 = 0;
      lVar49 = lVar40;
      do {
        EVar24 = 5;
        if (*(uint *)(lVar39 + lVar32) == 0) break;
        if (*(byte *)((long)puVar34 + 0xf4) <= (byte)uVar42) {
          onBeforeInvoke();
          goto LAB_0014a30a;
        }
        lVar8 = *(long *)((long)puVar34 + 0x360);
        uVar18 = *(uint *)(lVar8 + lVar32 * 4 + lVar40);
        if (uVar18 == 0) {
          EVar24 = 7;
        }
        else {
          arg = (FuncValue *)(lVar39 + lVar32);
          imm_ = (Imm *)(lVar8 + lVar49);
          uVar18 = uVar18 & 7;
          EVar14 = EStackY_260;
          if (uVar18 == 4) {
            if ((*(uint *)(lVar39 + lVar32) >> 8 & 1) == 0) {
              EVar23 = moveImmToStackArg((RACFGBuilder *)pBVar36,(InvokeNode *)invokeNode,arg,imm_);
              EVar24 = 1;
              EVar13 = EVar23;
              goto joined_r0x00149c67;
            }
            OStackY_230._signature._bits = 1;
            OStackY_230._baseId = 0xff;
            OStackY_230._data[0] = 0;
            OStackY_230._data[1] = 0;
            EVar23 = moveImmToRegArg((RACFGBuilder *)pBVar36,(InvokeNode *)invokeNode,arg,imm_,
                                     (BaseReg *)&OStackY_230);
            if (EVar23 == 0) {
              auVar11._4_4_ = OStackY_230._baseId;
              auVar11._0_4_ = OStackY_230._signature._bits;
              auVar11._8_4_ = OStackY_230._data[0];
              auVar11._12_4_ = OStackY_230._data[1];
              *(undefined1 (*) [16])(*(long *)((long)puVar34 + 0x360) + lVar32 * 4 + lVar40) =
                   auVar11;
              goto LAB_00149c85;
            }
            EVar24 = 1;
            EStackY_260 = EVar23;
          }
          else {
            if (uVar18 == 1) {
              pBVar30 = (BaseRAPass *)(pBVar36->super_FuncPass).super_Pass._vptr_Pass;
              uVar18 = *(int *)(lVar8 + 4 + lVar32 * 4 + lVar40) - 0x100;
              pBVar6 = (pBVar30->super_FuncPass).super_Pass._cb;
              if (uVar18 < *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
                invokeNode = (&(pBVar6[1].super_BaseEmitter._code)->_environment)[uVar18];
                lVar9 = *(long *)((long)invokeNode + 0x28);
                OStackY_220._signature._bits = (int)lVar9;
                OStackY_220._baseId = (int)((ulong)lVar9 >> 0x20);
                EVar23 = 0;
                if (lVar9 == 0) {
                  EVar23 = BaseRAPass::_asWorkReg
                                     (pBVar30,(VirtReg *)invokeNode,(RAWorkReg **)&OStackY_220);
                }
              }
              else {
                EVar23 = 0x1e;
              }
              EVar24 = 1;
              EVar14 = EVar23;
              EVar13 = EVar24;
              if (EVar23 == 0) {
                uVar18 = arg->_data;
                if ((uVar18 >> 8 & 1) == 0) {
                  if ((uVar18 >> 10 & 1) == 0) {
                    EVar23 = moveRegToStackArg((RACFGBuilder *)pBVar36,(InvokeNode *)invokeNode,arg,
                                               (BaseReg *)imm_);
                  }
                  else {
                    uVar18 = *(uint *)(lVar8 + lVar32 * 4 + lVar40);
                    if ((uVar18 & 0xf00) == 0) {
                      EVar23 = 0x19;
                      EVar14 = 0x19;
                      if (EVar35._arch == (Arch)(uVar18 >> 3)) {
                        EVar23 = moveRegToStackArg((RACFGBuilder *)pBVar36,(InvokeNode *)invokeNode,
                                                   arg,(BaseReg *)imm_);
                        EVar24 = 1;
                        EVar14 = EVar23;
                        EVar13 = EVar24;
                        if (EVar23 == 0) {
                          EVar24 = 7;
                          EVar23 = EStackY_260;
                          EVar14 = EStackY_260;
                          EVar13 = EVar24;
                        }
                      }
                      goto joined_r0x00149c67;
                    }
                    OStackY_230._signature._bits = 1;
                    OStackY_230._baseId = 0xff;
                    OStackY_230._data[0] = 0;
                    OStackY_230._data[1] = 0;
                    invokeNode = (Environment)puVar34;
                    pFStackY_208 = arg;
                    moveVecToPtr((RACFGBuilder *)pBVar36,(InvokeNode *)puVar34,arg,(Vec *)imm_,
                                 (BaseReg *)&OStackY_230);
                    EVar23 = moveRegToStackArg((RACFGBuilder *)pBVar36,(InvokeNode *)invokeNode,
                                               pFStackY_208,(BaseReg *)&OStackY_230);
                  }
                  EVar14 = EVar23;
                  if (EVar23 != 0) goto joined_r0x00149c67;
                }
                else {
                  if (0x1fffffff < uVar18) goto LAB_0014a30f;
                  if ((uVar18 >> 10 & 1) == 0) {
                    if (((*(uint *)(OStackY_220._0_8_ + 0x20) ^
                         *(uint *)(_archTraits + (ulong)(uVar18 >> 0x18) * 4 + 0xec)) & 0xf00) == 0)
                    goto LAB_00149eec;
                    EStackY_260 = 0x19;
LAB_00149f0b:
                    bVar52 = false;
                  }
                  else {
                    uVar18 = *(uint *)(lVar8 + lVar32 * 4 + lVar40);
                    if ((uVar18 & 0xf00) == 0) {
                      EVar24 = 1;
                      if (EVar35._arch == (Arch)(uVar18 >> 3)) {
                        EVar24 = 7;
                      }
                      else {
                        EStackY_260 = 0x19;
                      }
                      goto LAB_00149f0b;
                    }
                    OStackY_230._signature._bits = 1;
                    OStackY_230._baseId = 0xff;
                    OStackY_230._data[0] = 0;
                    OStackY_230._data[1] = 0;
                    invokeNode = (Environment)puVar34;
                    moveVecToPtr((RACFGBuilder *)pBVar36,(InvokeNode *)puVar34,arg,(Vec *)imm_,
                                 (BaseReg *)&OStackY_230);
                    auVar12._4_4_ = OStackY_230._baseId;
                    auVar12._0_4_ = OStackY_230._signature._bits;
                    auVar12._8_4_ = OStackY_230._data[0];
                    auVar12._12_4_ = OStackY_230._data[1];
                    *(undefined1 (*) [16])(*(long *)((long)puVar34 + 0x360) + lVar32 * 4 + lVar40) =
                         auVar12;
LAB_00149eec:
                    EVar24 = 0;
                    bVar52 = true;
                  }
                  EVar23 = EStackY_260;
                  EVar14 = EStackY_260;
                  EVar13 = EVar24;
                  if (!bVar52) goto joined_r0x00149c67;
                }
                EVar24 = 0;
                EVar23 = EStackY_260;
                EVar14 = EStackY_260;
                EVar13 = EVar24;
              }
joined_r0x00149c67:
              EStackY_260 = EVar23;
              if (EVar13 != 0) goto LAB_00149c87;
            }
LAB_00149c85:
            EStackY_260 = EVar14;
            EVar24 = 0;
          }
        }
LAB_00149c87:
        if ((EVar24 != 7) && (EVar24 != 0)) break;
        lVar32 = lVar32 + 4;
        lVar49 = lVar49 + 0x10;
        EVar24 = 5;
      } while (lVar32 != 0x10);
      if (EVar24 == 5) {
        EVar24 = 0;
      }
      if (EVar24 != 0) goto LAB_00149f60;
      uVar42 = uVar42 + 1;
      lVar39 = lVar39 + 0x10;
      lVar40 = lVar40 + 0x40;
    } while (uVar42 != uStackY_200);
    EVar24 = 2;
LAB_00149f60:
    bVar52 = EVar24 == 2;
    pIVar48 = (InstNode *)(ulong)EStackY_260;
  }
  EVar24 = (Error)pIVar48;
  if (bVar52) {
    pBVar6 = (pBVar36->super_FuncPass).super_Pass._cb;
    pBVar6->_cursor = (BaseNode *)puVar34;
    if (((*(byte *)((long)puVar34 + 0x88) & 1) != 0) && (*(int *)((long)puVar34 + 0x108) != 0)) {
      OStackY_230._signature._bits = (pBVar6->super_BaseEmitter)._gpSignature._bits;
      OStackY_230._baseId = 4;
      OStackY_230._data[0] = 0;
      OStackY_230._data[1] = 0;
      OStackY_220._data[0] = *(int *)((long)puVar34 + 0x108);
      OStackY_220._signature._bits = 4;
      OStackY_220._baseId = 0;
      OStackY_220._data[1] = 0;
      EVar24 = BaseEmitter::_emitI(&pBVar6->super_BaseEmitter,0x311,&OStackY_230,&OStackY_220);
      pIVar48 = (InstNode *)((ulong)pIVar48 & 0xffffffff);
      if (EVar24 != 0) {
        pIVar48 = (InstNode *)(ulong)EVar24;
      }
      if (EVar24 != 0) {
        return (Error)pIVar48;
      }
    }
    if (*(int *)((long)puVar34 + 0x10c) != 0) {
      lVar39 = 199;
      do {
        if (*(int *)((long)puVar34 + 0x45 + lVar39) == 0) {
          iVar20 = 0x16;
        }
        else {
          iVar20 = 0;
          if ((*(uint *)((long)puVar34 + lVar39 * 4) & 7) == 1) {
            pBVar30 = (BaseRAPass *)(pBVar36->super_FuncPass).super_Pass._vptr_Pass;
            uVar18 = *(int *)((long)puVar34 + 4 + lVar39 * 4) - 0x100;
            pBVar6 = (pBVar30->super_FuncPass).super_Pass._cb;
            if (uVar18 < *(uint *)&pBVar6[1].super_BaseEmitter._logger) {
              EVar35 = (&(pBVar6[1].super_BaseEmitter._code)->_environment)[uVar18];
              pRStackY_210 = *(RAWorkReg **)((long)EVar35 + 0x28);
              uVar18 = 0;
              if (pRStackY_210 == (RAWorkReg *)0x0) {
                uVar18 = BaseRAPass::_asWorkReg(pBVar30,(VirtReg *)EVar35,&pRStackY_210);
              }
            }
            else {
              uVar18 = 0x1e;
            }
            iVar20 = 1;
            pIVar48 = (InstNode *)((ulong)pIVar48 & 0xffffffff);
            if (uVar18 == 0) {
              uVar18 = *(uint *)((long)puVar34 + 0x45 + lVar39);
              if ((uVar18 >> 8 & 1) == 0) {
LAB_0014a084:
                iVar20 = 0;
              }
              else if (uVar18 >> 0x18 == 0x16) {
                uVar21 = *(uint *)(pRStackY_210 + 0x20);
                if ((uVar21 & 0xf00) == 0x100) {
                  OStackY_230._baseId = *(uint32_t *)(pRStackY_210 + 4);
                  OStackY_230._data[0] = 0;
                  OStackY_230._data[1] = 0;
                  OStackY_220._0_12_ = ZEXT812(2);
                  OStackY_220._data[1] = 0;
                  cVar17 = (char)uVar18;
                  if ((char)uVar18 == '\0') {
                    cVar17 = TypeUtils::_typeData[*(byte *)(*(long *)(pRStackY_210 + 8) + 0xd)];
                  }
                  OStackY_230._signature._bits = uVar21;
                  if (cVar17 == '+') {
                    uVar18 = BaseRAPass::useTemporaryMem
                                       ((BaseRAPass *)
                                        (pBVar36->super_FuncPass).super_Pass._vptr_Pass,
                                        (BaseMem *)&OStackY_220,8,4);
                    if (uVar18 == 0) {
                      OStackY_220._signature._bits._3_1_ = 8;
                      EVar24 = BaseEmitter::_emitI(&((pBVar36->super_FuncPass).super_Pass._cb)->
                                                    super_BaseEmitter,0x103,&OStackY_220);
                      if (EVar24 == 0) {
                        IVar33 = 0x4c1;
                        if (pBVar36->field_0x292 == '\0') {
                          IVar33 = 0x1d6;
                        }
                        uVar18 = BaseEmitter::_emitI(&((pBVar36->super_FuncPass).super_Pass._cb)->
                                                      super_BaseEmitter,IVar33,&OStackY_230,
                                                     &OStackY_220);
LAB_0014a275:
                        if (uVar18 == 0) {
                          bVar52 = true;
                          goto LAB_0014a287;
                        }
                        pIVar48 = (InstNode *)(ulong)uVar18;
                      }
                      else {
                        pIVar48 = (InstNode *)(ulong)EVar24;
                      }
                      goto LAB_0014a27d;
                    }
LAB_0014a208:
                    pIVar48 = (InstNode *)(ulong)uVar18;
                    bVar52 = false;
                  }
                  else if (cVar17 == '*') {
                    uVar18 = BaseRAPass::useTemporaryMem
                                       ((BaseRAPass *)
                                        (pBVar36->super_FuncPass).super_Pass._vptr_Pass,
                                        (BaseMem *)&OStackY_220,4,4);
                    if (uVar18 != 0) goto LAB_0014a208;
                    OStackY_220._signature._bits._3_1_ = 4;
                    EVar24 = BaseEmitter::_emitI(&((pBVar36->super_FuncPass).super_Pass._cb)->
                                                  super_BaseEmitter,0x103,&OStackY_220);
                    if (EVar24 == 0) {
                      IVar33 = 0x4c5;
                      if (pBVar36->field_0x292 == '\0') {
                        IVar33 = 0x1d9;
                      }
                      uVar18 = BaseEmitter::_emitI(&((pBVar36->super_FuncPass).super_Pass._cb)->
                                                    super_BaseEmitter,IVar33,&OStackY_230,
                                                   &OStackY_220);
                      goto LAB_0014a275;
                    }
                    pIVar48 = (InstNode *)(ulong)EVar24;
LAB_0014a27d:
                    bVar52 = false;
                  }
                  else {
                    pIVar48 = (InstNode *)0x19;
                    bVar52 = false;
                  }
LAB_0014a287:
                  if (bVar52) goto LAB_0014a084;
                }
                else {
                  pIVar48 = (InstNode *)0x19;
                }
              }
              else {
                if (0x1fffffff < uVar18) {
LAB_0014a314:
                  onBeforeInvoke();
                  __clang_call_terminate(extraout_RAX);
                }
                if (((*(uint *)(_archTraits + (ulong)(uVar18 >> 0x18) * 4 + 0xec) ^
                     *(uint *)(pRStackY_210 + 0x20)) & 0xf00) == 0) goto LAB_0014a084;
                pIVar48 = (InstNode *)0x19;
              }
            }
            else {
              pIVar48 = (InstNode *)(ulong)uVar18;
            }
          }
        }
        if (iVar20 != 0) goto LAB_0014a2b0;
        lVar39 = lVar39 + 4;
      } while (lVar39 != 0xd7);
      iVar20 = 0x16;
LAB_0014a2b0:
      if (iVar20 != 0x16) {
        return (Error)pIVar48;
      }
    }
    puVar3 = (uint *)((pBVar36->super_FuncPass).super_Pass._name + 0xc);
    *puVar3 = *puVar3 | 0x1000;
    p_Var10 = (pBVar36->super_FuncPass).super_Pass._vptr_Pass[0x13];
    *(uint *)(p_Var10 + 0x2d0) = *(uint *)(p_Var10 + 0x2d0) | 0x20;
    uVar18 = *(uint *)((long)puVar34 + 0x108);
    if (*(uint *)((long)puVar34 + 0x108) < *(uint *)(p_Var10 + 0x2e0)) {
      uVar18 = *(uint *)(p_Var10 + 0x2e0);
    }
    *(uint *)(p_Var10 + 0x2e0) = uVar18;
    EVar24 = 0;
  }
  return EVar24;
}

Assistant:

Error RACFGBuilder::onInst(InstNode* inst, InstControlFlow& cf, RAInstBuilder& ib) noexcept {
  InstRWInfo rwInfo;

  InstId instId = inst->id();
  if (Inst::isDefinedId(instId)) {
    uint32_t opCount = inst->opCount();
    const Operand* opArray = inst->operands();
    ASMJIT_PROPAGATE(InstInternal::queryRWInfo(_arch, inst->baseInst(), opArray, opCount, &rwInfo));

    const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
    bool hasGpbHiConstraint = false;
    uint32_t singleRegOps = 0;

    // Copy instruction RW flags to instruction builder except kMovOp, which is propagated manually later.
    ib.addInstRWFlags(rwInfo.instFlags() & ~InstRWFlags::kMovOp);

    // Mask of all operand types used by the instruction - can be used as an optimization later.
    uint32_t opTypesMask = 0u;

    if (opCount) {
      // The mask is for all registers, but we are mostly interested in AVX-512 registers at the moment. The mask
      // will be combined with all available registers of the Compiler at the end so we it never use more registers
      // than available.
      RegMask instructionAllowedRegs = 0xFFFFFFFFu;

      uint32_t consecutiveOffset = 0;
      uint32_t consecutiveLeadId = Globals::kInvalidId;
      uint32_t consecutiveParent = Globals::kInvalidId;

      if (instInfo.isEvex()) {
        // EVEX instruction and VEX instructions that can be encoded with EVEX have the possibility to use 32 SIMD
        // registers (XMM/YMM/ZMM).
        if (instInfo.isVex() && !instInfo.isEvexCompatible()) {
          if (instInfo.isEvexKRegOnly()) {
            // EVEX encodable only if the first operand is K register (compare instructions).
            if (!Reg::isKReg(opArray[0]))
              instructionAllowedRegs = 0xFFFFu;
          }
          else if (instInfo.isEvexTwoOpOnly()) {
            // EVEX encodable only if the instruction has two operands (gather instructions).
            if (opCount != 2)
              instructionAllowedRegs = 0xFFFFu;
          }
          else {
            instructionAllowedRegs = 0xFFFFu;
          }
        }
      }
      else if (instInfo.isEvexTransformable()) {
        ib.addAggregatedFlags(RATiedFlags::kInst_IsTransformable);
      }
      else {
        // Not EVEX, restrict everything to [0-15] registers.
        instructionAllowedRegs = 0xFFFFu;
      }

      for (uint32_t i = 0; i < opCount; i++) {
        const Operand& op = opArray[i];
        const OpRWInfo& opRwInfo = rwInfo.operand(i);

        opTypesMask |= 1u << uint32_t(op.opType());

        if (op.isReg()) {
          // Register Operand
          // ----------------
          const Reg& reg = op.as<Reg>();

          RATiedFlags flags = raRegRwFlags(opRwInfo.opFlags());
          RegMask allowedRegs = instructionAllowedRegs;

          if (opRwInfo.isUnique())
            flags |= RATiedFlags::kUnique;

          // X86-specific constraints related to LO|HI general purpose registers. This is only required when the
          // register is part of the encoding. If the register is fixed we won't restrict anything as it doesn't
          // restrict encoding of other registers.
          if (reg.isGpb() && !opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
            flags |= RATiedFlags::kX86_Gpb;
            if (!_is64Bit) {
              // Restrict to first four - AL|AH|BL|BH|CL|CH|DL|DH. In 32-bit mode it's not possible to access
              // SIL|DIL, etc, so this is just enough.
              allowedRegs = 0x0Fu;
            }
            else {
              // If we encountered GPB-HI register the situation is much more complicated than in 32-bit mode.
              // We need to patch all registers to not use ID higher than 7 and all GPB-LO registers to not use
              // index higher than 3. Instead of doing the patching here we just set a flag and will do it later,
              // to not complicate this loop.
              if (reg.isGpbHi()) {
                hasGpbHiConstraint = true;
                allowedRegs = 0x0Fu;
              }
            }
          }

          uint32_t vIndex = Operand::virtIdToIndex(reg.id());
          if (vIndex < Operand::kVirtIdCount) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

            // Use RW instead of Write in case that not the whole register is overwritten. This is important
            // for liveness as we cannot kill a register that will be used. For example `mov al, 0xFF` is not
            // a write-only operation if user allocated the whole `rax` register.
            if ((flags & RATiedFlags::kRW) == RATiedFlags::kWrite) {
              if (workReg->regByteMask() & ~(opRwInfo.writeByteMask() | opRwInfo.extendByteMask())) {
                // Not write-only operation.
                flags = (flags & ~RATiedFlags::kOut) | (RATiedFlags::kRead | RATiedFlags::kUse);
              }
            }

            // Do not use RegMem flag if changing Reg to Mem requires a CPU feature that is not available.
            if (rwInfo.rmFeature() && Support::test(flags, RATiedFlags::kUseRM | RATiedFlags::kOutRM)) {
              if (!cc()->code()->cpuFeatures().has(rwInfo.rmFeature())) {
                flags &= ~(RATiedFlags::kUseRM | RATiedFlags::kOutRM);
              }
            }

            RegGroup group = workReg->group();
            RegMask useRegs = _pass->_availableRegs[group] & allowedRegs;
            RegMask outRegs = useRegs;

            uint32_t useId = BaseReg::kIdBad;
            uint32_t outId = BaseReg::kIdBad;

            uint32_t useRewriteMask = 0;
            uint32_t outRewriteMask = 0;

            if (opRwInfo.consecutiveLeadCount()) {
              // There must be a single consecutive register lead, otherwise the RW data is invalid.
              if (consecutiveLeadId != Globals::kInvalidId)
                return DebugUtils::errored(kErrorInvalidState);

              // A consecutive lead register cannot be used as a consecutive +1/+2/+3 register, the registers must be distinct.
              if (RATiedReg::consecutiveDataFromFlags(flags) != 0)
                return DebugUtils::errored(kErrorNotConsecutiveRegs);

              flags |= RATiedFlags::kLeadConsecutive | RATiedReg::consecutiveDataToFlags(opRwInfo.consecutiveLeadCount() - 1);
              consecutiveLeadId = workReg->workId();

              RegMask filter = raConsecutiveLeadCountToRegMaskFilter[opRwInfo.consecutiveLeadCount()];
              if (Support::test(flags, RATiedFlags::kUse)) {
                flags |= RATiedFlags::kUseConsecutive;
                useRegs &= filter;
              }
              else {
                flags |= RATiedFlags::kOutConsecutive;
                outRegs &= filter;
              }
            }

            if (Support::test(flags, RATiedFlags::kUse)) {
              useRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                useId = opRwInfo.physId();
                flags |= RATiedFlags::kUseFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kUseConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }
            else {
              outRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                outId = opRwInfo.physId();
                flags |= RATiedFlags::kOutFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kOutConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }

            ASMJIT_PROPAGATE(ib.add(workReg, flags, useRegs, useId, useRewriteMask, outRegs, outId, outRewriteMask, opRwInfo.rmSize(), consecutiveParent));
            if (singleRegOps == i)
              singleRegOps++;

            if (Support::test(flags, RATiedFlags::kLeadConsecutive | RATiedFlags::kUseConsecutive | RATiedFlags::kOutConsecutive))
              consecutiveParent = workReg->workId();
          }
        }
        else if (op.isMem()) {
          // Memory Operand
          // --------------
          const Mem& mem = op.as<Mem>();
          ib.addForbiddenFlags(RATiedFlags::kUseRM | RATiedFlags::kOutRM);

          if (mem.isRegHome()) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(mem.baseId()), &workReg));
            _pass->getOrCreateStackSlot(workReg);
          }
          else if (mem.hasBaseReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.baseId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemBaseRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group];

              uint32_t useId = BaseReg::kIdBad;
              uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse)) {
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  useId = opRwInfo.physId();
                  flags |= RATiedFlags::kUseFixed;
                }
              }
              else {
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  outId = opRwInfo.physId();
                  flags |= RATiedFlags::kOutFixed;
                }
              }

              ASMJIT_PROPAGATE(ib.add(workReg, flags, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }

          if (mem.hasIndexReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.indexId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemIndexRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group] & instructionAllowedRegs;

              // Index registers have never fixed id on X86/x64.
              const uint32_t useId = BaseReg::kIdBad;
              const uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse))
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));
              else
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));

              ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }
        }
      }
    }

    // Handle extra operand (either REP {cx|ecx|rcx} or AVX-512 {k} selector).
    if (inst->hasExtraReg()) {
      uint32_t vIndex = Operand::virtIdToIndex(inst->extraReg().id());
      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        uint32_t rewriteMask = Support::bitMask(inst->getRewriteIndex(&inst->extraReg()._id));

        if (group == RegGroup::kX86_K) {
          // AVX-512 mask selector {k} register - read-only, allocable to any register except {k0}.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, BaseReg::kIdBad, rewriteMask, inOutRegs, BaseReg::kIdBad, 0));
          singleRegOps = 0;
        }
        else {
          // REP {cx|ecx|rcx} register - read & write, allocable to {cx|ecx|rcx} only.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRW, inOutRegs, Gp::kIdCx, rewriteMask, inOutRegs, Gp::kIdBad, 0));
        }
      }
      else {
        RegGroup group = inst->extraReg().group();
        if (group == RegGroup::kX86_K && inst->extraReg().id() != 0)
          singleRegOps = 0;
      }
    }

    // If this instruction has move semantics then check whether it could be eliminated if all virtual registers
    // are allocated into the same register. Take into account the virtual size of the destination register as that's
    // more important than a physical register size in this case.
    if (rwInfo.hasInstFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg() && Support::bitTest(opTypesMask, uint32_t(OperandType::kReg))) {
      // AVX+ move instructions have 3 operand form - the first two operands must be the same to guarantee move semantics.
      if (opCount == 2 || (opCount == 3 && opArray[0] == opArray[1])) {
        uint32_t vIndex = Operand::virtIdToIndex(opArray[0].as<Reg>().id());
        if (vIndex < Operand::kVirtIdCount) {
          const VirtReg* vReg = _cc->virtRegByIndex(vIndex);
          const OpRWInfo& opRwInfo = rwInfo.operand(0);

          uint64_t remainingByteMask = vReg->workReg()->regByteMask() & ~opRwInfo.writeByteMask();
          if (remainingByteMask == 0u || (remainingByteMask & opRwInfo.extendByteMask()) == 0)
            ib.addInstRWFlags(InstRWFlags::kMovOp);
        }
      }
    }

    // Handle X86 constraints.
    if (hasGpbHiConstraint) {
      for (RATiedReg& tiedReg : ib) {
        RegMask filter = tiedReg.hasFlag(RATiedFlags::kX86_Gpb) ? 0x0Fu : 0xFFu;
        tiedReg._useRegMask &= filter;
        tiedReg._outRegMask &= filter;
      }
    }

    if (ib.tiedRegCount() == 1) {
      // Handle special cases of some instructions where all operands share the same
      // register. In such case the single operand becomes read-only or write-only.
      InstSameRegHint sameRegHint = InstSameRegHint::kNone;
      if (singleRegOps == opCount) {
        sameRegHint = instInfo.sameRegHint();
      }
      else if (opCount == 2 && inst->op(1).isImm()) {
        // Handle some tricks used by X86 asm.
        const BaseReg& reg = inst->op(0).as<BaseReg>();
        const Imm& imm = inst->op(1).as<Imm>();

        const RAWorkReg* workReg = _pass->workRegById(ib[0]->workId());
        uint32_t workRegSize = workReg->signature().size();

        switch (inst->id()) {
          case Inst::kIdOr: {
            // Sets the value of the destination register to -1, previous content unused.
            if (reg.size() >= 4 || reg.size() >= workRegSize) {
              if (imm.value() == -1 || imm.valueAs<uint64_t>() == raImmMaskFromSize(reg.size()))
                sameRegHint = InstSameRegHint::kWO;
            }
            ASMJIT_FALLTHROUGH;
          }

          case Inst::kIdAdd:
          case Inst::kIdAnd:
          case Inst::kIdRol:
          case Inst::kIdRor:
          case Inst::kIdSar:
          case Inst::kIdShl:
          case Inst::kIdShr:
          case Inst::kIdSub:
          case Inst::kIdXor: {
            // Updates [E|R]FLAGS without changing the content.
            if (reg.size() != 4 || reg.size() >= workRegSize) {
              if (imm.value() == 0)
                sameRegHint = InstSameRegHint::kRO;
            }
            break;
          }
        }
      }
      else if (opCount == 4 && inst->op(3).isImm()) {
        const Imm& imm = inst->op(3).as<Imm>();

        switch (inst->id()) {
          case Inst::kIdVpternlogd:
          case Inst::kIdVpternlogq: {
            uint32_t predicate = uint32_t(imm.value() & 0xFFu);
            if (predicate == 0x00u || predicate == 0xFFu) {
              ib[0]->makeWriteOnly();
            }
            break;
          }
        }
      }

      switch (sameRegHint) {
        case InstSameRegHint::kNone:
          break;
        case InstSameRegHint::kRO:
          ib[0]->makeReadOnly();
          break;
        case InstSameRegHint::kWO:
          ib[0]->makeWriteOnly();
          break;
      }
    }

    cf = instInfo.controlFlow();
  }

  return kErrorOk;
}